

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX.c
# Opt level: O0

uint32_t FAPOFX_CreateFX(FAudioGUID *clsid,FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize)

{
  uint32_t uVar1;
  undefined4 in_ECX;
  FAudioMallocFunc in_RDX;
  undefined8 in_RSI;
  void *in_RDI;
  FAPO **unaff_retaddr;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = FAPOFX_CreateFXWithCustomAllocatorEXT
                    ((FAudioGUID *)CONCAT44(InitDataByteSize,in_stack_00000008),unaff_retaddr,in_RDI
                     ,(uint32_t)((ulong)in_RSI >> 0x20),in_RDX,
                     (FAudioFreeFunc)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (FAudioReallocFunc)clsid);
  return uVar1;
}

Assistant:

uint32_t FAPOFX_CreateFX(
	const FAudioGUID *clsid,
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize
) {
	return FAPOFX_CreateFXWithCustomAllocatorEXT(
		clsid,
		pEffect,
		pInitData,
		InitDataByteSize,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}